

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O3

int testFileWriterTestsOffsetNotAligned(void)

{
  pointer puVar1;
  string *filePath;
  ostream *poVar2;
  unsigned_long size;
  SpanSize<18446744073709551615UL> SVar3;
  pointer ptVar4;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  AutoDeleteTempFile tempfile;
  FileWriter writer;
  allocator_type local_271;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_270;
  AutoDeleteTempFile local_258;
  FileWriter local_230;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_258);
  local_230.m_fileStream = (fstream)0xa;
  local_230._1_3_ = 0x281e14;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_230;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_270,__l,&local_271);
  puVar1 = local_270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  filePath = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_258);
  MILBlob::Blob::FileWriter::FileWriter(&local_230,filePath,true);
  SVar3.m_size = (long)local_270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  ptVar4 = (pointer)0x0;
  if (SVar3.m_size != 0) {
    ptVar4 = puVar1;
  }
  data.m_size.m_size = SVar3.m_size;
  data.m_ptr = ptVar4;
  MILBlob::Blob::FileWriter::WriteData(&local_230,data,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x8b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,": expected exception, but none thrown.\n",0x27);
  MILBlob::Blob::FileWriter::~FileWriter(&local_230);
  if (local_270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_270.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_258);
  return 1;
}

Assistant:

int testFileWriterTestsOffsetNotAligned()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 3;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);

        FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
        ML_ASSERT_THROWS_WITH_MESSAGE(writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset),
                                      std::runtime_error,
                                      "Provided offset not aligned.");
    }

    return 0;
}